

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetFloatVerifier::verifyFloat2Expanded
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1)

{
  ostringstream *this_00;
  bool bVar1;
  StateQueryMemoryWriteGuard<float[2]> floatVector2;
  StateQueryMemoryWriteGuard<float[2]> local_1a8;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  local_1a8.m_postguard[0] = -8.0297587e+18;
  local_1a8.m_postguard[1] = -8.0297587e+18;
  local_1a8.m_preguard[0] = -8.0297587e+18;
  local_1a8.m_preguard[1] = -8.0297587e+18;
  local_1a8.m_value[0] = -8.0297587e+18;
  local_1a8.m_value[1] = -8.0297587e+18;
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1a8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[2]>::verifyValidity
                    (&local_1a8,testCtx);
  if (bVar1) {
    if ((local_1a8.m_value[0] == reference0) && (!NAN(local_1a8.m_value[0]) && !NAN(reference0))) {
      if ((local_1a8.m_value[1] == reference1) && (!NAN(local_1a8.m_value[1]) && !NAN(reference1)))
      {
        return;
      }
    }
    local_190._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR: expected ",0x13);
    std::ostream::_M_insert<double>((double)reference0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<double>((double)reference1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"; got ",6);
    std::ostream::_M_insert<double>((double)local_1a8.m_value[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    std::ostream::_M_insert<double>((double)local_1a8.m_value[1]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_118);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float value");
    }
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyFloat2Expanded (tcu::TestContext& testCtx, GLenum name, GLfloat reference0, GLfloat reference1)
{
	DE_ASSERT(de::inRange(reference0, -1.0f, 1.0f));
	DE_ASSERT(de::inRange(reference1, -1.0f, 1.0f));

	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[2]> floatVector2;
	glGetFloatv(name, floatVector2);

	if (!floatVector2.verifyValidity(testCtx))
		return;

	if (floatVector2[0] != reference0 ||
		floatVector2[1] != reference1)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << reference0 << ", " << reference1 << "; got " << floatVector2[0] << " " << floatVector2[1] << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
	}
}